

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYValue * gvr::anon_unknown_3::createValue(ply_type type,ply_encoding encoding)

{
  bool bVar1;
  PLYValue *pPVar2;
  PLYValueSwapFloat64 *this;
  int in_ESI;
  int in_EDI;
  PLYValueASCIIDouble *in_stack_ffffffffffffff20;
  
  if (in_ESI != 0) {
    if (in_ESI == 2) {
      switch(in_EDI) {
      case 1:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueInt8::PLYValueInt8((PLYValueInt8 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 2:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueUInt8::PLYValueUInt8((PLYValueUInt8 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 3:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueBigInt16::PLYValueBigInt16((PLYValueBigInt16 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 4:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueBigUInt16::PLYValueBigUInt16((PLYValueBigUInt16 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 5:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueBigInt32::PLYValueBigInt32((PLYValueBigInt32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 6:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueBigUInt32::PLYValueBigUInt32((PLYValueBigUInt32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 7:
        bVar1 = gutil::isMSBFirst();
        if (!bVar1) {
          pPVar2 = (PLYValue *)operator_new(0x10);
          PLYValueSwapFloat32::PLYValueSwapFloat32((PLYValueSwapFloat32 *)in_stack_ffffffffffffff20)
          ;
          return pPVar2;
        }
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueFloat32::PLYValueFloat32((PLYValueFloat32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 8:
        bVar1 = gutil::isMSBFirst();
        if (!bVar1) {
          pPVar2 = (PLYValue *)operator_new(0x10);
          PLYValueSwapFloat64::PLYValueSwapFloat64((PLYValueSwapFloat64 *)in_stack_ffffffffffffff20)
          ;
          return pPVar2;
        }
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueFloat64::PLYValueFloat64((PLYValueFloat64 *)in_stack_ffffffffffffff20);
        return pPVar2;
      }
    }
    else if (in_ESI == 3) {
      switch(in_EDI) {
      case 1:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueInt8::PLYValueInt8((PLYValueInt8 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 2:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueUInt8::PLYValueUInt8((PLYValueUInt8 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 3:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueLittleInt16::PLYValueLittleInt16((PLYValueLittleInt16 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 4:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueLittleUInt16::PLYValueLittleUInt16
                  ((PLYValueLittleUInt16 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 5:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueLittleInt32::PLYValueLittleInt32((PLYValueLittleInt32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 6:
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueLittleUInt32::PLYValueLittleUInt32
                  ((PLYValueLittleUInt32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 7:
        bVar1 = gutil::isMSBFirst();
        if (bVar1) {
          pPVar2 = (PLYValue *)operator_new(0x10);
          PLYValueSwapFloat32::PLYValueSwapFloat32((PLYValueSwapFloat32 *)in_stack_ffffffffffffff20)
          ;
          return pPVar2;
        }
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueFloat32::PLYValueFloat32((PLYValueFloat32 *)in_stack_ffffffffffffff20);
        return pPVar2;
      case 8:
        bVar1 = gutil::isMSBFirst();
        if (bVar1) {
          this = (PLYValueSwapFloat64 *)operator_new(0x10);
          PLYValueSwapFloat64::PLYValueSwapFloat64(this);
          return &this->super_PLYValue;
        }
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueFloat64::PLYValueFloat64((PLYValueFloat64 *)in_stack_ffffffffffffff20);
        return pPVar2;
      }
    }
    return (PLYValue *)0x0;
  }
  if (in_EDI == 1) {
LAB_00147b0e:
    pPVar2 = (PLYValue *)operator_new(0x10);
    PLYValueASCIIInt::PLYValueASCIIInt((PLYValueASCIIInt *)in_stack_ffffffffffffff20);
    return pPVar2;
  }
  if (in_EDI != 2) {
    if (in_EDI == 3) goto LAB_00147b0e;
    if (in_EDI != 4) {
      if (in_EDI == 5) goto LAB_00147b0e;
      if (in_EDI != 6) {
        if (1 < in_EDI - 7U) {
          return (PLYValue *)0x0;
        }
        pPVar2 = (PLYValue *)operator_new(0x10);
        PLYValueASCIIDouble::PLYValueASCIIDouble(in_stack_ffffffffffffff20);
        return pPVar2;
      }
    }
  }
  pPVar2 = (PLYValue *)operator_new(0x10);
  PLYValueASCIIUInt::PLYValueASCIIUInt((PLYValueASCIIUInt *)in_stack_ffffffffffffff20);
  return pPVar2;
}

Assistant:

PLYValue *createValue(ply_type type, ply_encoding encoding)
{
  if (encoding == ply_ascii)
  {
    switch (type)
    {
      case ply_int8:
      case ply_int16:
      case ply_int32:
        return new PLYValueASCIIInt();

      case ply_uint8:
      case ply_uint16:
      case ply_uint32:
        return new PLYValueASCIIUInt();

      case ply_float32:
      case ply_float64:
        return new PLYValueASCIIDouble();

      default:
        break;
    }
  }
  else if (encoding == ply_big_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueBigInt16();

      case ply_uint16:
        return new PLYValueBigUInt16();

      case ply_int32:
        return new PLYValueBigInt32();

      case ply_uint32:
        return new PLYValueBigUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat32();
        }
        else
        {
          return new PLYValueSwapFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat64();
        }
        else
        {
          return new PLYValueSwapFloat64();
        }

      default:
        break;
    }
  }
  else if (encoding == ply_little_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueLittleInt16();

      case ply_uint16:
        return new PLYValueLittleUInt16();

      case ply_int32:
        return new PLYValueLittleInt32();

      case ply_uint32:
        return new PLYValueLittleUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat32();
        }
        else
        {
          return new PLYValueFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat64();
        }
        else
        {
          return new PLYValueFloat64();
        }

      default:
        break;
    }
  }

  assert(false);

  return 0;
}